

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshFace::IsValid(ON_MeshFace *this,int mesh_vertex_count,ON_3dPoint *V)

{
  bool bVar1;
  
  bVar1 = IsValid(this,mesh_vertex_count);
  if (((((bVar1) && (bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[1]), bVar1)) &&
       (bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[2]), bVar1)) &&
      (bVar1 = ON_3dPoint::operator!=(V + this->vi[1],V + this->vi[2]), bVar1)) &&
     ((this->vi[2] == this->vi[3] ||
      (((bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[3]), bVar1 &&
        (bVar1 = ON_3dPoint::operator!=(V + this->vi[1],V + this->vi[3]), bVar1)) &&
       (bVar1 = ON_3dPoint::operator!=(V + this->vi[2],V + this->vi[3]), bVar1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count, const ON_3dPoint* V ) const
{
  if ( !IsValid(mesh_vertex_count) )
    return false;
  if ( !(V[vi[0]] != V[vi[1]]) )
    return false;
  if ( !(V[vi[0]] != V[vi[2]]) )
    return false;
  if ( !(V[vi[1]] != V[vi[2]]) )
    return false;
  if ( vi[2] != vi[3] )
  {
  if ( !(V[vi[0]] != V[vi[3]]) )
    return false;
  if ( !(V[vi[1]] != V[vi[3]]) )
    return false;
  if ( !(V[vi[2]] != V[vi[3]]) )
    return false;
  }
  return true;
}